

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thief.c
# Opt level: O3

void do_strip(CHAR_DATA *ch,char *argument)

{
  undefined2 uVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  CHAR_DATA *ch_00;
  OBJ_DATA *obj;
  char arg1 [4608];
  char arg2 [4608];
  OBJ_DATA local_2438 [13];
  char local_1238 [4616];
  
  if (*argument == '\0') {
    send_to_char("Strip what from whom?\n\r",ch);
    return;
  }
  pcVar7 = one_argument(argument,(char *)local_2438);
  one_argument(pcVar7,local_1238);
  iVar4 = get_skill(ch,(int)gsn_strip);
  if (iVar4 == 0) {
    pcVar7 = "Huh?\n\r";
  }
  else if (local_1238[0] == '\0') {
    pcVar7 = "Strip whom?\n\r";
  }
  else {
    ch_00 = get_char_room(ch,local_1238);
    if (ch_00 == (CHAR_DATA *)0x0) {
      pcVar7 = "They aren\'t here.\n\r";
    }
    else if (ch_00 == ch) {
      pcVar7 = "That would be silly.\n\r";
    }
    else {
      if ((char)local_2438[0].next != '\0') {
        obj = ch_00->carrying;
        if (obj != (OBJ_DATA *)0x0) {
          do {
            if ((obj->wear_loc != -1) && (bVar3 = is_name((char *)local_2438,obj->name), bVar3)) {
              if ((0x13 < (ushort)obj->wear_loc) ||
                 ((0x834a0U >> ((ushort)obj->wear_loc & 0x1f) & 1) == 0)) {
                iVar5 = get_curr_stat(ch,3);
                bVar3 = is_npc(ch_00);
                iVar6 = ((int)ch->level - (int)ch_00->level) * 2;
                if (bVar3) {
                  iVar6 = ((int)ch_00->level - (int)ch->level) * -5;
                }
                bVar3 = can_see(ch_00,ch);
                iVar2 = iVar6 + 5;
                if (bVar3) {
                  iVar2 = iVar6 + -0x19;
                }
                iVar2 = iVar2 + iVar4 / 2 + iVar5 * 6;
                bVar3 = is_affected_by(ch,0xf);
                iVar4 = iVar2 + -0x82;
                if (bVar3) {
                  iVar4 = iVar2 + -0x78;
                }
                bVar3 = is_awake(ch_00);
                if (bVar3) {
                  iVar6 = get_curr_stat(ch_00,3);
                  iVar4 = iVar4 + iVar6 * -2 + 0x1e;
                }
                else {
                  iVar4 = iVar4 + 0x19;
                }
                bVar3 = is_npc(ch_00);
                iVar6 = iVar4;
                if ((bVar3) && (iVar6 = 0, ch_00->pIndexData->pShop == (SHOP_DATA *)0x0)) {
                  iVar6 = iVar4;
                }
                bVar3 = is_awake(ch_00);
                if ((((!bVar3) || (uVar1 = obj->wear_loc, 1 < (ushort)(uVar1 - 1))) &&
                    (bVar3 = is_awake(ch_00), bVar3)) ||
                   (iVar4 = number_percent(), iVar6 + -0x1e <= iVar4)) {
                  act("Oops.",ch,(void *)0x0,ch_00,3);
                  thief_yell(ch,ch_00);
                  check_improve(ch,(int)gsn_strip,false,1);
                }
                else {
                  unequip_char(ch_00,obj,true);
                  obj_from_char(obj);
                  obj_to_char(obj,ch);
                  act("You silently strip $p from $N.",ch,obj,ch_00,3);
                  check_improve(ch,(int)gsn_strip,true,1);
                  iVar4 = number_range(1,5);
                  if (3 < iVar4) {
                    act("You botch your strip, still managing to get $p, but $N wakes up!",ch,obj,
                        ch_00,3);
                    act("$n botches $s strip, still managing to get $p from you!",ch,obj,ch_00,2);
                    thief_yell(ch,ch_00);
                  }
                }
                WAIT_STATE(ch,0x18);
                return;
              }
              pcVar7 = "You couldn\'t possibly strip that!";
              goto LAB_0034d31e;
            }
            obj = obj->next_content;
          } while (obj != (OBJ_DATA *)0x0);
        }
        pcVar7 = "$N is not wearing $t.";
        obj = local_2438;
LAB_0034d31e:
        act(pcVar7,ch,obj,ch_00,3);
        return;
      }
      pcVar7 = "Strip what?\n\r";
    }
  }
  send_to_char(pcVar7,ch);
  return;
}

Assistant:

void do_strip(CHAR_DATA *ch, char *argument)
{
	CHAR_DATA *victim;
	OBJ_DATA *obj;
	char arg1[MSL], arg2[MSL];
	int chance;

	if (argument[0] == '\0')
	{
		send_to_char("Strip what from whom?\n\r", ch);
		return;
	}

	argument = one_argument(argument, arg1);
	argument = one_argument(argument, arg2);

	chance = get_skill(ch, gsn_strip);

	if (chance == 0)
	{
		send_to_char("Huh?\n\r", ch);
		return;
	}

	if (arg2[0] == '\0')
	{
		send_to_char("Strip whom?\n\r", ch);
		return;
	}

	victim = get_char_room(ch, arg2);

	if (victim == nullptr)
	{
		send_to_char("They aren't here.\n\r", ch);
		return;
	}

	if (victim == ch)
	{
		send_to_char("That would be silly.\n\r", ch);
		return;
	}

	if (arg1[0] == '\0')
	{
		send_to_char("Strip what?\n\r", ch);
		return;
	}

	for (obj = victim->carrying; obj; obj = obj->next_content)
	{
		if (obj->wear_loc != WEAR_NONE && is_name(arg1, obj->name))
			break;
	}

	if (!obj)
	{
		act("$N is not wearing $t.", ch, arg1, victim, TO_CHAR);
		return;
	}

	if (obj->wear_loc == WEAR_BODY
		|| obj->wear_loc == WEAR_ARMS
		|| obj->wear_loc == WEAR_LEGS
		|| obj->wear_loc == WEAR_WAIST
		|| obj->wear_loc == WEAR_ABOUT
		|| obj->wear_loc == WEAR_BRAND)
	{
		act("You couldn't possibly strip that!", ch, obj, victim, TO_CHAR);
		return;
	}

	chance /= 2;
	chance += 6 * (get_curr_stat(ch, STAT_DEX) - 20);

	if (is_npc(victim))
		chance -= 5 * (victim->level - ch->level);
	else
		chance -= 2 * (victim->level - ch->level);

	if (can_see(victim, ch))
		chance -= 25;
	else
		chance += 5;

	if (!is_affected_by(ch, AFF_SNEAK))
		chance -= 10;

	if (!is_awake(victim))
		chance += 25;
	else
		chance -= 2 * (get_curr_stat(victim, STAT_DEX) - 15);

	if (is_npc(victim) && victim->pIndexData->pShop)
		chance = 0;

	if ((is_awake(victim)
			&& (obj->wear_loc == WEAR_FINGER_L || obj->wear_loc == WEAR_FINGER_R))
		|| (!is_awake(victim)))
	{
		if (number_percent() < (chance - 30))
		{
			unequip_char(victim, obj, true);

			obj_from_char(obj);
			obj_to_char(obj, ch);

			act("You silently strip $p from $N.", ch, obj, victim, TO_CHAR);

			check_improve(ch, gsn_strip, true, 1);

			if (number_range(1, 5) > 3)
			{
				act("You botch your strip, still managing to get $p, but $N wakes up!", ch, obj, victim, TO_CHAR);
				act("$n botches $s strip, still managing to get $p from you!", ch, obj, victim, TO_VICT);
				thief_yell(ch, victim);
			}
		}
		else
		{
			act("Oops.", ch, 0, victim, TO_CHAR);
			thief_yell(ch, victim);
			check_improve(ch, gsn_strip, false, 1);
		}
	}
	else
	{
		act("Oops.", ch, 0, victim, TO_CHAR);
		thief_yell(ch, victim);
		check_improve(ch, gsn_strip, false, 1);
	}

	WAIT_STATE(ch, PULSE_VIOLENCE * 2);
}